

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O0

int __thiscall
highs::CacheMinRbTree<HighsNodeQueue::NodeLowerRbTree>::link
          (CacheMinRbTree<HighsNodeQueue::NodeLowerRbTree> *this,char *__from,char *__to)

{
  int iVar1;
  tuple<double,_int,_double,_long> *ptVar2;
  tuple<double,_int,_double,_long> *in_stack_ffffffffffffff88;
  tuple<double,_int,_double,_long> *__t;
  bool local_61;
  HighsInt in_stack_ffffffffffffffd4;
  NodeLowerRbTree *in_stack_ffffffffffffffd8;
  
  if ((char *)*this->first_ == __to) {
    __t = (tuple<double,_int,_double,_long> *)__to;
    ptVar2 = (tuple<double,_int,_double,_long> *)RbTreeLinks<long>::noLink<long,_0>();
    local_61 = true;
    if (__t != ptVar2) {
      HighsNodeQueue::NodeLowerRbTree::getKey(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
      HighsNodeQueue::NodeLowerRbTree::getKey(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
      local_61 = std::operator<(__t,in_stack_ffffffffffffff88);
    }
    if (local_61 != false) {
      *this->first_ = (LinkType)__from;
    }
  }
  iVar1 = RbTree<HighsNodeQueue::NodeLowerRbTree>::link
                    (&this->super_RbTree<HighsNodeQueue::NodeLowerRbTree>,__from,__to);
  return iVar1;
}

Assistant:

void link(LinkType z, LinkType parent) {
    if (first_ == parent) {
      if (parent == RbTreeLinks<LinkType>::noLink() ||
          static_cast<const Impl*>(this)->getKey(z) <
              static_cast<const Impl*>(this)->getKey(parent))
        first_ = z;
    }

    RbTree<Impl>::link(z, parent);
  }